

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O1

bool __thiscall
ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486>::parseReturnBuffer
          (ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  uint8_t *buf;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  buf = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  bVar1 = ProtocolBase::isValid
                    (&this->super_ProtocolBase,buf,
                     (long)(buffer->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)buf);
  if (bVar1) {
    if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[7] != '\x01') {
      return false;
    }
    pcVar3 = "OK::ProtocolWrite::Write succeeded";
    lVar2 = 0x22;
  }
  else {
    pcVar3 = "ERROR::ProtocolWrite::Received Frame is not valid";
    lVar2 = 0x31;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return bVar1;
}

Assistant:

bool parseReturnBuffer(std::vector<uint8_t> &buffer) {
        if (!isValid(&buffer[0], buffer.size())) {
            std::cout << "ERROR::ProtocolWrite::Received Frame is not valid" << std::endl;
            return false;
        }

        if(buffer[7] == 0x01) {
            std::cout << "OK::ProtocolWrite::Write succeeded" << std::endl;
            return true;
        }
        else
            return false;

    }